

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

uint __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::GetMarkCountOnHeapBlockMap
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  ushort uVar1;
  char *pcVar2;
  Recycler *pRVar3;
  char *local_38;
  char *page;
  HeapBlockMap *blockMap;
  char *endPage;
  char *startPage;
  uint heapBlockMapMarkCount;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  startPage._4_4_ = 0;
  local_38 = GetAddress(this);
  pcVar2 = GetEndAddress(this);
  pRVar3 = GetRecycler(this);
  for (; local_38 < pcVar2; local_38 = local_38 + 0x1000) {
    uVar1 = HeapBlockMap64::GetPageMarkCount(&pRVar3->heapBlockMap,local_38);
    startPage._4_4_ = uVar1 + startPage._4_4_;
  }
  return startPage._4_4_;
}

Assistant:

uint
SmallHeapBlockT<TBlockAttributes>::GetMarkCountOnHeapBlockMap() const
{
    uint heapBlockMapMarkCount = 0;
    char* startPage = this->GetAddress();
    char* endPage = this->GetEndAddress();
    const HeapBlockMap& blockMap = this->GetRecycler()->heapBlockMap;
    for (char* page = startPage; page < endPage; page += AutoSystemInfo::PageSize)
    {
        heapBlockMapMarkCount += blockMap.GetPageMarkCount(page);
    }
    return heapBlockMapMarkCount;
}